

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createGarbagePointSet
          (int hash,size_t numPoints,bool mblur,Ref<embree::SceneGraph::MaterialNode> *material)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  size_t sVar4;
  uint uVar5;
  _func_int **pp_Var6;
  reference pvVar7;
  unsigned_long *puVar8;
  Vec3fx *pVVar9;
  byte in_CL;
  ulong in_RDX;
  int in_ESI;
  Node *in_RDI;
  long *in_R8;
  float r_1;
  float z_1;
  float y_1;
  float x_1;
  float r;
  float z;
  float y;
  float x;
  size_t i;
  Ref<embree::SceneGraph::PointSetNode> mesh;
  RandomSampler sampler;
  Vec3fx v_9;
  Vec3fx v_4;
  uint hash_1;
  anon_union_4_2_947300a4 v_8;
  anon_union_4_2_947300a4 v_7;
  anon_union_4_2_947300a4 v_6;
  anon_union_4_2_947300a4 v_5;
  anon_union_4_2_947300a4 v_3;
  anon_union_4_2_947300a4 v_2;
  anon_union_4_2_947300a4 v_1;
  anon_union_4_2_947300a4 v;
  uint n;
  uint m;
  uint r2;
  uint r1;
  uint c2;
  uint c1;
  uint n_1;
  uint m_1;
  uint n_2;
  uint m_2;
  uint n_3;
  uint m_3;
  uint n_4;
  uint m_4;
  uint n_5;
  uint m_5;
  uint n_6;
  uint m_6;
  uint n_7;
  uint m_7;
  uint n_8;
  uint m_8;
  size_t i_4;
  size_t i_3;
  Vec3fx *old_items;
  size_t i_2;
  size_t i_1;
  size_t i_8;
  size_t i_7;
  Vec3fx *old_items_1;
  size_t i_6;
  size_t i_5;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  void *in_stack_fffffffffffffa48;
  size_t in_stack_fffffffffffffa50;
  size_t in_stack_fffffffffffffa58;
  size_t in_stack_fffffffffffffad0;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffad8;
  reference pvVar10;
  undefined8 in_stack_fffffffffffffae0;
  RTCGeometryType type;
  size_t sVar11;
  PointSetNode *in_stack_fffffffffffffae8;
  BBox1f in_stack_fffffffffffffaf0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  uint local_498;
  uint local_494;
  uint local_490;
  uint local_48c;
  undefined8 local_488;
  undefined8 uStack_480;
  uint local_478;
  uint local_474;
  uint local_470;
  uint local_46c;
  ulong local_468;
  undefined1 local_45d;
  undefined4 local_45c;
  undefined4 local_458;
  undefined4 local_454;
  undefined4 uStack_450;
  long *local_440;
  _func_int **local_438;
  uint local_42c [4];
  byte local_419;
  ulong local_418;
  long **local_3f8;
  undefined4 *local_3f0;
  undefined4 *local_3e8;
  undefined4 *local_3e0;
  long **local_3d8;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b8;
  reference local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 *local_398;
  reference local_390;
  _func_int **local_388;
  _func_int ***local_380;
  _func_int ***local_378;
  _func_int ***local_370;
  _func_int ***local_368;
  _func_int ***local_358;
  uint local_348;
  uint *local_340;
  uint *local_338;
  uint *local_330;
  uint *local_328;
  uint *local_320;
  uint *local_318;
  uint *local_310;
  uint *local_308;
  uint *local_300;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  uint local_2e0;
  uint local_2dc;
  uint local_2d8;
  uint local_2d4;
  uint local_2d0;
  uint local_2cc;
  uint local_2c8;
  uint local_2c4;
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  undefined8 *local_2a8;
  uint local_2a0;
  uint local_29c;
  uint local_298;
  uint local_294;
  undefined8 *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  uint local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  uint local_258;
  uint local_254;
  uint local_250;
  uint local_24c;
  undefined8 *local_248;
  Vec3fx *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 *local_228;
  Vec3fx *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined4 local_204;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  uint local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  int local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  int local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  int local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  uint local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  int local_19c;
  undefined4 local_198;
  undefined4 local_194;
  int local_190;
  undefined4 local_18c;
  undefined4 local_188;
  int local_184;
  _func_int **local_180;
  ulong local_170;
  ulong local_168;
  Vec3fx *local_160;
  ulong local_158;
  ulong local_150;
  size_t local_148;
  ulong local_140;
  reference local_138;
  size_t local_130;
  reference local_128;
  Vec3fx *local_120;
  Vec3fx *local_118;
  size_t local_110;
  Vec3fx *local_108;
  reference local_100;
  ulong local_f8;
  ulong local_f0;
  Vec3fx *local_e8;
  ulong local_e0;
  ulong local_d8;
  size_t local_d0;
  ulong local_c8;
  reference local_c0;
  size_t local_b8;
  reference local_b0;
  Vec3fx *local_a8;
  Vec3fx *local_a0;
  size_t local_98;
  Vec3fx *local_90;
  reference local_88;
  unsigned_long local_80 [2];
  ulong local_70;
  ulong local_68;
  reference local_60;
  size_t local_58;
  unsigned_long local_50 [2];
  ulong local_40;
  ulong local_38;
  reference local_30;
  size_t local_28;
  Vec3fx *local_20;
  Vec3fx *local_18;
  Vec3fx *local_10;
  Vec3fx *local_8;
  
  type = (RTCGeometryType)((ulong)in_stack_fffffffffffffae0 >> 0x20);
  local_419 = in_CL & 1;
  local_340 = local_42c;
  local_1f0 = 0xcc9e2d51;
  local_1f4 = 0x1b873593;
  local_1f8 = 0xf;
  local_1fc = 0xd;
  local_200 = 5;
  local_204 = 0xe6546b64;
  uVar5 = in_ESI * 0x16a88000 | (uint)(in_ESI * -0x3361d2af) >> 0x11;
  local_1ec = uVar5 * 0x1b873593;
  local_1e8 = (uVar5 * -0x194da000 | local_1ec >> 0x13) * 5 + 0xe6546b64;
  uVar5 = (local_1e8 >> 0x10 ^ local_1e8) * -0x7a143595;
  local_348 = (uVar5 >> 0xd ^ uVar5) * -0x3d4d51cb;
  local_348 = local_348 >> 0x10 ^ local_348;
  local_418 = in_RDX;
  local_1e4 = local_348;
  local_42c[0] = local_348;
  pp_Var6 = (_func_int **)operator_new(0xb0);
  local_45d = 1;
  local_3f8 = &local_440;
  local_440 = (long *)*in_R8;
  if (local_440 != (long *)0x0) {
    (**(code **)(*local_440 + 0x10))();
  }
  local_458 = 0;
  local_45c = 0x3f800000;
  local_3e0 = &local_454;
  local_3e8 = &local_458;
  local_3f0 = &local_45c;
  local_454 = 0;
  uStack_450 = 0x3f800000;
  PointSetNode::PointSetNode
            (in_stack_fffffffffffffae8,type,in_stack_fffffffffffffad8,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffad0);
  local_45d = 0;
  local_380 = &local_438;
  local_388 = pp_Var6;
  local_438 = pp_Var6;
  if (pp_Var6 != (_func_int **)0x0) {
    (**(code **)(*pp_Var6 + 0x10))();
  }
  local_3d8 = &local_440;
  if (local_440 != (long *)0x0) {
    (**(code **)(*local_440 + 0x18))();
  }
  for (local_468 = 0; local_468 < local_418; local_468 = local_468 + 1) {
    local_300 = local_42c;
    local_1d8 = local_42c[0];
    local_1dc = 0x19660d;
    local_1e0 = 0x3c6ef35f;
    local_1cc = local_42c[0] * 0x19660d + 0x3c6ef35f;
    local_46c = local_42c[0];
    local_308 = local_42c;
    local_1d0 = 0x19660d;
    local_1d4 = 0x3c6ef35f;
    local_1c0 = local_1cc * 0x19660d + 0x3c6ef35f;
    local_470 = local_42c[0];
    local_310 = local_42c;
    local_1c4 = 0x19660d;
    local_1c8 = 0x3c6ef35f;
    local_1b4 = local_1c0 * 0x19660d + 0x3c6ef35f;
    local_474 = local_42c[0];
    local_318 = local_42c;
    local_1b8 = 0x19660d;
    local_1bc = 0x3c6ef35f;
    local_478 = local_42c[0];
    local_370 = &local_438;
    local_2d8 = local_478;
    local_2d4 = local_478;
    local_2d0 = local_474;
    local_2cc = local_474;
    local_2c8 = local_470;
    local_2c4 = local_470;
    local_2c0 = local_46c;
    local_2bc = local_46c;
    local_42c[0] = local_1b4 * 0x19660d + 0x3c6ef35f;
    pvVar7 = std::
             vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                           *)(local_438 + 0xf),0);
    local_2a8 = &local_488;
    local_2ac = local_46c;
    local_2b0 = local_470;
    local_2b4 = local_474;
    local_2b8 = local_478;
    local_24c = local_478;
    local_250 = local_474;
    local_254 = local_470;
    local_258 = local_46c;
    local_268 = CONCAT44(local_470,local_46c);
    uStack_260 = CONCAT44(local_478,local_474);
    local_398 = &local_488;
    local_230 = &local_3a8;
    sVar11 = pvVar7->size_active;
    local_68 = pvVar7->size_active + 1;
    local_390 = pvVar7;
    local_238 = local_398;
    local_60 = pvVar7;
    local_488 = local_268;
    uStack_480 = uStack_260;
    local_3a8 = local_268;
    uStack_3a0 = uStack_260;
    if (pvVar7->size_alloced < local_68) {
      sVar4 = local_68;
      if (pvVar7->size_alloced != 0) {
        local_70 = pvVar7->size_alloced;
        while (local_70 < local_68) {
          local_80[1] = 1;
          local_80[0] = local_70 << 1;
          puVar8 = std::max<unsigned_long>(local_80 + 1,local_80);
          local_70 = *puVar8;
        }
        local_58 = local_70;
        sVar4 = local_58;
      }
    }
    else {
      sVar4 = pvVar7->size_alloced;
    }
    local_58 = sVar4;
    local_148 = local_58;
    uVar1 = sVar11;
    if (sVar11 < pvVar7->size_active) {
      while (local_150 = uVar1, local_150 < pvVar7->size_active) {
        uVar1 = local_150 + 1;
      }
      pvVar7->size_active = sVar11;
    }
    pvVar10 = pvVar7;
    local_140 = sVar11;
    local_138 = pvVar7;
    if (local_58 == pvVar7->size_alloced) {
      for (local_158 = pvVar7->size_active; local_158 < sVar11; local_158 = local_158 + 1) {
        local_10 = pvVar7->items + local_158;
      }
      pvVar7->size_active = sVar11;
    }
    else {
      local_160 = pvVar7->items;
      local_130 = local_58;
      local_128 = pvVar7;
      pVVar9 = (Vec3fx *)alignedMalloc(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
      pvVar7->items = pVVar9;
      for (local_168 = 0; local_168 < pvVar7->size_active; local_168 = local_168 + 1) {
        local_118 = pvVar7->items + local_168;
        local_120 = local_160 + local_168;
        uVar2 = *(undefined8 *)((long)&local_120->field_0 + 8);
        *(undefined8 *)&local_118->field_0 = *(undefined8 *)&local_120->field_0;
        *(undefined8 *)((long)&local_118->field_0 + 8) = uVar2;
      }
      for (local_170 = pvVar7->size_active; local_170 < local_140; local_170 = local_170 + 1) {
        local_8 = pvVar7->items + local_170;
      }
      local_110 = pvVar7->size_alloced;
      local_108 = local_160;
      local_100 = pvVar7;
      alignedFree(in_stack_fffffffffffffa48);
      pvVar7->size_active = local_140;
      pvVar7->size_alloced = local_148;
    }
    sVar11 = pvVar10->size_active;
    pvVar10->size_active = sVar11 + 1;
    local_240 = pvVar10->items + sVar11;
    local_248 = &local_3a8;
    *(undefined8 *)&local_240->field_0 = local_3a8;
    *(undefined8 *)((long)&local_240->field_0 + 8) = uStack_3a0;
    if ((local_419 & 1) != 0) {
      local_320 = local_42c;
      local_1a8 = local_42c[0];
      local_1ac = 0x19660d;
      local_1b0 = 0x3c6ef35f;
      local_19c = local_42c[0] * 0x19660d + 0x3c6ef35f;
      local_48c = local_42c[0];
      local_328 = local_42c;
      local_1a0 = 0x19660d;
      local_1a4 = 0x3c6ef35f;
      local_190 = local_19c * 0x19660d + 0x3c6ef35f;
      local_490 = local_42c[0];
      local_330 = local_42c;
      local_194 = 0x19660d;
      local_198 = 0x3c6ef35f;
      local_184 = local_190 * 0x19660d + 0x3c6ef35f;
      local_494 = local_42c[0];
      local_338 = local_42c;
      local_188 = 0x19660d;
      local_18c = 0x3c6ef35f;
      local_498 = local_42c[0];
      local_378 = &local_438;
      local_2f8 = local_498;
      local_2f4 = local_498;
      local_2f0 = local_494;
      local_2ec = local_494;
      local_2e8 = local_490;
      local_2e4 = local_490;
      local_2e0 = local_48c;
      local_2dc = local_48c;
      local_42c[0] = local_184 * 0x19660d + 0x3c6ef35f;
      pvVar7 = std::
               vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                             *)(local_438 + 0xf),1);
      local_290 = &local_4a8;
      local_294 = local_48c;
      local_298 = local_490;
      local_29c = local_494;
      local_2a0 = local_498;
      local_26c = local_498;
      local_270 = local_494;
      local_274 = local_490;
      local_278 = local_48c;
      local_288 = CONCAT44(local_490,local_48c);
      uStack_280 = CONCAT44(local_498,local_494);
      local_3b8 = &local_4a8;
      local_210 = &local_3c8;
      uVar1 = pvVar7->size_active;
      local_38 = pvVar7->size_active + 1;
      local_3b0 = pvVar7;
      local_218 = local_3b8;
      local_30 = pvVar7;
      local_4a8 = local_288;
      uStack_4a0 = uStack_280;
      local_3c8 = local_288;
      uStack_3c0 = uStack_280;
      if (pvVar7->size_alloced < local_38) {
        sVar11 = local_38;
        if (pvVar7->size_alloced != 0) {
          local_40 = pvVar7->size_alloced;
          while (local_40 < local_38) {
            local_50[1] = 1;
            local_50[0] = local_40 << 1;
            puVar8 = std::max<unsigned_long>(local_50 + 1,local_50);
            local_40 = *puVar8;
          }
          local_28 = local_40;
          sVar11 = local_28;
        }
      }
      else {
        sVar11 = pvVar7->size_alloced;
      }
      local_28 = sVar11;
      local_d0 = local_28;
      uVar3 = uVar1;
      if (uVar1 < pvVar7->size_active) {
        while (local_d8 = uVar3, local_d8 < pvVar7->size_active) {
          uVar3 = local_d8 + 1;
        }
        pvVar7->size_active = uVar1;
      }
      local_c8 = uVar1;
      local_c0 = pvVar7;
      if (local_28 == pvVar7->size_alloced) {
        for (local_e0 = pvVar7->size_active; local_e0 < uVar1; local_e0 = local_e0 + 1) {
          local_20 = pvVar7->items + local_e0;
        }
        pvVar7->size_active = uVar1;
      }
      else {
        local_e8 = pvVar7->items;
        local_b8 = local_28;
        local_b0 = pvVar7;
        pVVar9 = (Vec3fx *)alignedMalloc(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
        pvVar7->items = pVVar9;
        for (local_f0 = 0; local_f0 < pvVar7->size_active; local_f0 = local_f0 + 1) {
          local_a0 = pvVar7->items + local_f0;
          local_a8 = local_e8 + local_f0;
          uVar2 = *(undefined8 *)((long)&local_a8->field_0 + 8);
          *(undefined8 *)&local_a0->field_0 = *(undefined8 *)&local_a8->field_0;
          *(undefined8 *)((long)&local_a0->field_0 + 8) = uVar2;
        }
        for (local_f8 = pvVar7->size_active; local_f8 < local_c8; local_f8 = local_f8 + 1) {
          local_18 = pvVar7->items + local_f8;
        }
        local_98 = pvVar7->size_alloced;
        local_90 = local_e8;
        local_88 = pvVar7;
        alignedFree(in_stack_fffffffffffffa48);
        pvVar7->size_active = local_c8;
        pvVar7->size_alloced = local_d0;
      }
      sVar11 = pvVar7->size_active;
      pvVar7->size_active = sVar11 + 1;
      local_220 = pvVar7->items + sVar11;
      local_228 = &local_3c8;
      *(undefined8 *)&local_220->field_0 = local_3c8;
      *(undefined8 *)((long)&local_220->field_0 + 8) = uStack_3c0;
    }
  }
  local_368 = &local_438;
  local_180 = local_438;
  (in_RDI->super_RefCount)._vptr_RefCount = local_438;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_358 = &local_438;
  if (local_438 != (_func_int **)0x0) {
    (**(code **)(*local_438 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbagePointSet(int hash, size_t numPoints, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);

    Ref<SceneGraph::PointSetNode> mesh = new SceneGraph::PointSetNode(RTC_GEOMETRY_TYPE_SPHERE_POINT, material,BBox1f(0,1),mblur?2:1);

    for (size_t i = 0; i < numPoints; i++)
    {
      const float x = cast_i2f(RandomSampler_getUInt(sampler));
      const float y = cast_i2f(RandomSampler_getUInt(sampler));
      const float z = cast_i2f(RandomSampler_getUInt(sampler));
      const float r = cast_i2f(RandomSampler_getUInt(sampler));
      mesh->positions[0].push_back(Vec3ff(x, y, z, r));

      if (mblur)
      {
        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float r = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[1].push_back(Vec3ff(x, y, z, r));
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }